

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O0

void __thiscall OpenMD::MinimizerParameters::MinimizerParameters(MinimizerParameters *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __a;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar1;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  DataHolder *in_stack_fffffffffffff950;
  value_type *in_stack_fffffffffffff958;
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffff960;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_4c1 [73];
  double local_478;
  allocator<char> local_469;
  string local_468 [32];
  _Base_ptr local_448;
  undefined1 local_440;
  undefined8 *local_438;
  undefined1 local_429 [73];
  double local_3e0;
  allocator<char> local_3d1;
  string local_3d0 [32];
  _Base_ptr local_3b0;
  undefined1 local_3a8;
  undefined8 *local_3a0;
  allocator<char> local_391;
  string local_390 [72];
  double local_348;
  allocator<char> local_339;
  string local_338 [32];
  _Base_ptr local_318;
  undefined1 local_310;
  undefined8 *local_308;
  allocator<char> local_2f9;
  string local_2f8 [72];
  double local_2b0;
  allocator<char> local_2a1;
  string local_2a0 [32];
  _Base_ptr local_280;
  undefined1 local_278;
  undefined8 *local_270;
  allocator<char> local_261;
  string local_260 [72];
  int local_218;
  allocator<char> local_211;
  string local_210 [32];
  _Base_ptr local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  allocator<char> local_1d1;
  string local_1d0 [72];
  int local_188;
  allocator<char> local_181;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  undefined8 *local_150;
  allocator<char> local_141;
  string local_140 [79];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [78];
  bool local_3a;
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder(in_stack_fffffffffffff950);
  *in_RDI = &PTR__MinimizerParameters_005032a0;
  Parameter<bool>::Parameter((Parameter<bool> *)in_stack_fffffffffffff950);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff950);
  Parameter<int>::Parameter((Parameter<int> *)in_stack_fffffffffffff950);
  Parameter<int>::Parameter((Parameter<int> *)in_stack_fffffffffffff950);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff950);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff950);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff950);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff950);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  local_3a = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0xd),&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_a8 = (_Base_ptr)pVar1.first._M_node;
  local_a0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x266da9);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x13),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff950,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_150 = in_RDI + 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_160 = (_Base_ptr)pVar1.first._M_node;
  local_158 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x266f9f);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x1d),true);
  local_188 = 1000;
  Parameter<int>::setDefaultValue((Parameter<int> *)(in_RDI + 0x1d),&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_1e0 = in_RDI + 0x1d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_1f0 = (_Base_ptr)pVar1.first._M_node;
  local_1e8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x267144);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x23),true);
  local_218 = 100;
  Parameter<int>::setDefaultValue((Parameter<int> *)(in_RDI + 0x23),&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_270 = in_RDI + 0x23;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_280 = (_Base_ptr)pVar1.first._M_node;
  local_278 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2672e9);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x29),true);
  local_2b0 = 1e-05;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x29),&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_308 = in_RDI + 0x29;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_318 = (_Base_ptr)pVar1.first._M_node;
  local_310 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x267495);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x30),true);
  local_348 = 1e-05;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x30),&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_3a0 = in_RDI + 0x30;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_3b0 = (_Base_ptr)pVar1.first._M_node;
  local_3a8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x267629);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x37),true);
  local_3e0 = 1e-05;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x37),&local_3e0);
  __s = (char *)(in_RDI + 1);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_429;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffff980);
  local_438 = in_RDI + 0x37;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
             (ParameterBase **)in_stack_fffffffffffff950);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  __a = pVar1.first._M_node;
  local_440 = pVar1.second;
  local_448 = __a._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2677b1);
  std::__cxx11::string::~string((string *)(local_429 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff950,
             (string *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3e),true);
  local_478 = 0.1;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x3e),&local_478);
  __x = (value_type *)(in_RDI + 1);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)local_4c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&__x->first,(ParameterBase **)in_stack_fffffffffffff950);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x267939);
  std::__cxx11::string::~string((string *)(local_4c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4c1);
  return;
}

Assistant:

MinimizerParameters::MinimizerParameters() {
    DefineOptionalParameterWithDefaultValue(UseMinimizer, "useMinimizer",
                                            false);
    DefineOptionalParameterWithDefaultValue(Method, "method", "SD");
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            1000);
    DefineOptionalParameterWithDefaultValue(
        MaxStationaryStateIterations, "maxStationaryStateIterations", 100);
    DefineOptionalParameterWithDefaultValue(RootEpsilon, "rootEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(FunctionEpsilon, "functionEpsilon",
                                            1e-5);
    DefineOptionalParameterWithDefaultValue(GradientNormEpsilon,
                                            "gradientNormEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }